

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O0

bool duckdb::RLEFun::TypeIsSupported(PhysicalType physical_type)

{
  PhysicalType physical_type_local;
  bool local_1;
  
  switch(physical_type) {
  case UINT128:
  case INT128:
  case BOOL:
  case UINT8:
  case INT8:
  case UINT16:
  case INT16:
  case UINT32:
  case INT32:
  case UINT64:
  case INT64:
  case FLOAT:
  case DOUBLE:
  case LIST:
    local_1 = true;
    break;
  default:
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool RLEFun::TypeIsSupported(const PhysicalType physical_type) {
	switch (physical_type) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
	case PhysicalType::INT16:
	case PhysicalType::INT32:
	case PhysicalType::INT64:
	case PhysicalType::INT128:
	case PhysicalType::UINT8:
	case PhysicalType::UINT16:
	case PhysicalType::UINT32:
	case PhysicalType::UINT64:
	case PhysicalType::UINT128:
	case PhysicalType::FLOAT:
	case PhysicalType::DOUBLE:
	case PhysicalType::LIST:
		return true;
	default:
		return false;
	}
}